

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ali_emr_describe_execute_plan.cc
# Opt level: O1

int __thiscall
aliyun::Emr::DescribeExecutePlan
          (Emr *this,EmrDescribeExecutePlanRequestType *req,
          EmrDescribeExecutePlanResponseType *response,EmrErrorInfo *error_info)

{
  iterator *piVar1;
  pointer pcVar2;
  iterator __position;
  bool bVar3;
  int iVar4;
  Int IVar5;
  ArrayIndex AVar6;
  char *pcVar7;
  AliRpcRequest *this_00;
  long *plVar8;
  size_t sVar9;
  Value *pVVar10;
  Value *pVVar11;
  size_type *psVar12;
  uint uVar13;
  Value val;
  string secheme;
  string str_response;
  Reader reader;
  Value local_4b8;
  string local_4a0;
  Value *local_480;
  undefined1 local_478 [32];
  _Alloc_hider local_458;
  size_type local_450;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_448;
  _Alloc_hider local_438;
  size_type local_430;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_428;
  _Alloc_hider local_418;
  size_type local_410;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_408;
  _Alloc_hider local_3f8;
  size_type local_3f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3e8;
  Int local_3d8;
  Int local_3d4;
  _Alloc_hider local_3d0;
  size_type local_3c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3c0;
  _Alloc_hider local_3b0;
  size_type local_3a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3a0;
  _Alloc_hider local_390;
  size_type local_388;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_380;
  Value *local_370;
  uint local_364;
  undefined1 local_360 [32];
  _Alloc_hider local_340;
  size_type local_338;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_330;
  _Alloc_hider local_320;
  size_type local_318;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_310;
  _Alloc_hider local_300;
  size_type local_2f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2f0;
  long *local_2e0;
  long local_2d8;
  long local_2d0 [2];
  string local_2c0;
  string local_2a0;
  string local_280;
  string local_260;
  string local_240;
  string local_220;
  string local_200;
  string local_1e0;
  string local_1c0;
  string local_1a0;
  string local_180;
  string local_160;
  Reader local_140;
  
  local_2c0._M_dataplus._M_p = (pointer)&local_2c0.field_2;
  local_2c0._M_string_length = 0;
  local_2c0.field_2._M_local_buf[0] = '\0';
  pcVar7 = "http";
  if ((ulong)this->use_tls_ != 0) {
    pcVar7 = "https";
  }
  local_2e0 = local_2d0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_2e0,pcVar7,pcVar7 + (ulong)this->use_tls_ + 4);
  this_00 = (AliRpcRequest *)operator_new(0x2c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_160,this->version_,(allocator<char> *)local_478);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_180,this->appid_,(allocator<char> *)local_360);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1a0,this->secret_,(allocator<char> *)&local_4a0);
  piVar1 = &local_140.nodes_.c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
            _M_impl.super__Deque_impl_data._M_start;
  local_140.nodes_.c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
  super__Deque_impl_data._M_map = &piVar1->_M_cur;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_140,local_2e0,local_2d8 + (long)local_2e0);
  std::__cxx11::string::append((char *)&local_140);
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_140);
  psVar12 = (size_type *)(plVar8 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar12) {
    local_2a0.field_2._M_allocated_capacity = *psVar12;
    local_2a0.field_2._8_8_ = plVar8[3];
    local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
  }
  else {
    local_2a0.field_2._M_allocated_capacity = *psVar12;
    local_2a0._M_dataplus._M_p = (pointer)*plVar8;
  }
  local_2a0._M_string_length = plVar8[1];
  *plVar8 = (long)psVar12;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  AliRpcRequest::AliRpcRequest(this_00,&local_160,&local_180,&local_1a0,&local_2a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
    operator_delete(local_2a0._M_dataplus._M_p,local_2a0.field_2._M_allocated_capacity + 1);
  }
  if ((iterator *)
      local_140.nodes_.c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
      super__Deque_impl_data._M_map != piVar1) {
    operator_delete(local_140.nodes_.c.
                    super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
                    super__Deque_impl_data._M_map,
                    (long)local_140.nodes_.c.
                          super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
                          super__Deque_impl_data._M_start._M_cur + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
    operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._M_dataplus._M_p != &local_180.field_2) {
    operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != &local_160.field_2) {
    operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
  }
  if (((this->use_tls_ == false) && (pcVar7 = this->proxy_host_, pcVar7 != (char *)0x0)) &&
     (*pcVar7 != '\0')) {
    local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
    sVar9 = strlen(pcVar7);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e0,pcVar7,pcVar7 + sVar9);
    AliHttpRequest::SetHttpProxy((AliHttpRequest *)this_00,&local_1e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
      operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
    }
  }
  Json::Value::Value(&local_4b8,nullValue);
  Json::Reader::Reader(&local_140);
  local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_200,"Action","");
  local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_220,"DescribeExecutePlan","");
  AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_200,&local_220);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220._M_dataplus._M_p != &local_220.field_2) {
    operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_dataplus._M_p != &local_200.field_2) {
    operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
  }
  if ((req->id)._M_string_length != 0) {
    local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_240,"Id","");
    pcVar2 = (req->id)._M_dataplus._M_p;
    local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_260,pcVar2,pcVar2 + (req->id)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_240,&local_260);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_260._M_dataplus._M_p != &local_260.field_2) {
      operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240._M_dataplus._M_p != &local_240.field_2) {
      operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
    }
  }
  if ((this->region_id_ != (char *)0x0) && (*this->region_id_ != '\0')) {
    local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_280,"RegionId","");
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1c0,this->region_id_,(allocator<char> *)local_478);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_280,&local_1c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
      operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_280._M_dataplus._M_p != &local_280.field_2) {
      operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
    }
  }
  iVar4 = (**(this_00->super_AliHttpRequest)._vptr_AliHttpRequest)(this_00);
  if (iVar4 == 0) {
    iVar4 = AliHttpRequest::WaitResponseHeaderComplete((AliHttpRequest *)this_00);
    AliHttpRequest::ReadResponseBody((AliHttpRequest *)this_00,&local_2c0);
    if (((0 < iVar4) && (local_2c0._M_string_length != 0)) &&
       (bVar3 = Json::Reader::parse(&local_140,&local_2c0,&local_4b8,true), bVar3)) {
      if (error_info != (EmrErrorInfo *)0x0 && iVar4 != 200) {
        bVar3 = Json::Value::isMember(&local_4b8,"RequestId");
        if (bVar3) {
          pVVar10 = Json::Value::operator[](&local_4b8,"RequestId");
          Json::Value::asString_abi_cxx11_((string *)local_478,pVVar10);
        }
        else {
          local_478._0_8_ = local_478 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_478,anon_var_dwarf_1f029e + 9);
        }
        std::__cxx11::string::operator=((string *)error_info,(string *)local_478);
        pcVar2 = local_478 + 0x10;
        if ((pointer)local_478._0_8_ != pcVar2) {
          operator_delete((void *)local_478._0_8_,local_478._16_8_ + 1);
        }
        bVar3 = Json::Value::isMember(&local_4b8,"Code");
        if (bVar3) {
          pVVar10 = Json::Value::operator[](&local_4b8,"Code");
          Json::Value::asString_abi_cxx11_((string *)local_478,pVVar10);
        }
        else {
          local_478._0_8_ = pcVar2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_478,anon_var_dwarf_1f029e + 9);
        }
        std::__cxx11::string::operator=((string *)&error_info->code,(string *)local_478);
        if ((pointer)local_478._0_8_ != pcVar2) {
          operator_delete((void *)local_478._0_8_,local_478._16_8_ + 1);
        }
        bVar3 = Json::Value::isMember(&local_4b8,"HostId");
        if (bVar3) {
          pVVar10 = Json::Value::operator[](&local_4b8,"HostId");
          Json::Value::asString_abi_cxx11_((string *)local_478,pVVar10);
        }
        else {
          local_478._0_8_ = pcVar2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_478,anon_var_dwarf_1f029e + 9);
        }
        std::__cxx11::string::operator=((string *)&error_info->host_id,(string *)local_478);
        if ((pointer)local_478._0_8_ != pcVar2) {
          operator_delete((void *)local_478._0_8_,local_478._16_8_ + 1);
        }
        bVar3 = Json::Value::isMember(&local_4b8,"Message");
        if (bVar3) {
          pVVar10 = Json::Value::operator[](&local_4b8,"Message");
          Json::Value::asString_abi_cxx11_((string *)local_478,pVVar10);
        }
        else {
          local_478._0_8_ = pcVar2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_478,anon_var_dwarf_1f029e + 9);
        }
        std::__cxx11::string::operator=((string *)&error_info->message,(string *)local_478);
        if ((pointer)local_478._0_8_ != pcVar2) {
          operator_delete((void *)local_478._0_8_,local_478._16_8_ + 1);
        }
      }
      if (response != (EmrDescribeExecutePlanResponseType *)0x0 && iVar4 == 200) {
        bVar3 = Json::Value::isMember(&local_4b8,"Id");
        if (bVar3) {
          pVVar10 = Json::Value::operator[](&local_4b8,"Id");
          IVar5 = Json::Value::asInt(pVVar10);
          response->id = (long)IVar5;
        }
        bVar3 = Json::Value::isMember(&local_4b8,"Name");
        if (bVar3) {
          pVVar10 = Json::Value::operator[](&local_4b8,"Name");
          Json::Value::asString_abi_cxx11_((string *)local_478,pVVar10);
          std::__cxx11::string::operator=((string *)&response->name,(string *)local_478);
          if ((undefined1 *)local_478._0_8_ != local_478 + 0x10) {
            operator_delete((void *)local_478._0_8_,local_478._16_8_ + 1);
          }
        }
        bVar3 = Json::Value::isMember(&local_4b8,"Strategy");
        if (bVar3) {
          pVVar10 = Json::Value::operator[](&local_4b8,"Strategy");
          IVar5 = Json::Value::asInt(pVVar10);
          response->strategy = IVar5;
        }
        bVar3 = Json::Value::isMember(&local_4b8,"TimeInterval");
        if (bVar3) {
          pVVar10 = Json::Value::operator[](&local_4b8,"TimeInterval");
          IVar5 = Json::Value::asInt(pVVar10);
          response->time_interval = IVar5;
        }
        bVar3 = Json::Value::isMember(&local_4b8,"StartTime");
        if (bVar3) {
          pVVar10 = Json::Value::operator[](&local_4b8,"StartTime");
          Json::Value::asString_abi_cxx11_((string *)local_478,pVVar10);
          std::__cxx11::string::operator=((string *)&response->start_time,(string *)local_478);
          if ((undefined1 *)local_478._0_8_ != local_478 + 0x10) {
            operator_delete((void *)local_478._0_8_,local_478._16_8_ + 1);
          }
        }
        bVar3 = Json::Value::isMember(&local_4b8,"TimeUnit");
        if (bVar3) {
          pVVar10 = Json::Value::operator[](&local_4b8,"TimeUnit");
          Json::Value::asString_abi_cxx11_((string *)local_478,pVVar10);
          std::__cxx11::string::operator=((string *)&response->time_unit,(string *)local_478);
          if ((undefined1 *)local_478._0_8_ != local_478 + 0x10) {
            operator_delete((void *)local_478._0_8_,local_478._16_8_ + 1);
          }
        }
        bVar3 = Json::Value::isMember(&local_4b8,"IsCreateCluster");
        if (bVar3) {
          pVVar10 = Json::Value::operator[](&local_4b8,"IsCreateCluster");
          bVar3 = Json::Value::asBool(pVVar10);
          response->is_create_cluster = bVar3;
        }
        bVar3 = Json::Value::isMember(&local_4b8,"JobInfos");
        if (bVar3) {
          pVVar10 = Json::Value::operator[](&local_4b8,"JobInfos");
          bVar3 = Json::Value::isMember(pVVar10,"JobInfo");
          if (bVar3) {
            pVVar10 = Json::Value::operator[](&local_4b8,"JobInfos");
            pVVar10 = Json::Value::operator[](pVVar10,"JobInfo");
            bVar3 = Json::Value::isArray(pVVar10);
            if ((bVar3) && (AVar6 = Json::Value::size(pVVar10), AVar6 != 0)) {
              uVar13 = 0;
              do {
                pVVar11 = Json::Value::operator[](pVVar10,uVar13);
                bVar3 = Json::Value::isMember(pVVar11,"Id");
                if (bVar3) {
                  pVVar11 = Json::Value::operator[](pVVar11,"Id");
                  IVar5 = Json::Value::asInt(pVVar11);
                  local_478._0_8_ = SEXT48(IVar5);
                }
                __position._M_current = *(EmrDescribeExecutePlanJobInfoType **)&response->field_0x8;
                if (__position._M_current ==
                    *(EmrDescribeExecutePlanJobInfoType **)&response->field_0x10) {
                  std::
                  vector<aliyun::EmrDescribeExecutePlanJobInfoType,std::allocator<aliyun::EmrDescribeExecutePlanJobInfoType>>
                  ::_M_realloc_insert<aliyun::EmrDescribeExecutePlanJobInfoType_const&>
                            ((vector<aliyun::EmrDescribeExecutePlanJobInfoType,std::allocator<aliyun::EmrDescribeExecutePlanJobInfoType>>
                              *)response,__position,(EmrDescribeExecutePlanJobInfoType *)local_478);
                }
                else {
                  (__position._M_current)->id = local_478._0_8_;
                  *(EmrDescribeExecutePlanJobInfoType **)&response->field_0x8 =
                       __position._M_current + 1;
                }
                AVar6 = Json::Value::size(pVVar10);
                uVar13 = uVar13 + 1;
              } while (uVar13 < AVar6);
            }
          }
        }
        bVar3 = Json::Value::isMember(&local_4b8,"ClusterInfo");
        if (bVar3) {
          pVVar10 = Json::Value::operator[](&local_4b8,"ClusterInfo");
          bVar3 = Json::Value::isMember(pVVar10,"ClusterId");
          if (bVar3) {
            pVVar11 = Json::Value::operator[](pVVar10,"ClusterId");
            IVar5 = Json::Value::asInt(pVVar11);
            (response->cluster_info).cluster_id = (long)IVar5;
          }
          bVar3 = Json::Value::isMember(pVVar10,"BizId");
          if (bVar3) {
            pVVar11 = Json::Value::operator[](pVVar10,"BizId");
            Json::Value::asString_abi_cxx11_((string *)local_478,pVVar11);
            std::__cxx11::string::operator=
                      ((string *)&(response->cluster_info).biz_id,(string *)local_478);
            if ((undefined1 *)local_478._0_8_ != local_478 + 0x10) {
              operator_delete((void *)local_478._0_8_,local_478._16_8_ + 1);
            }
          }
          bVar3 = Json::Value::isMember(pVVar10,"ClusterName");
          if (bVar3) {
            pVVar11 = Json::Value::operator[](pVVar10,"ClusterName");
            Json::Value::asString_abi_cxx11_((string *)local_478,pVVar11);
            std::__cxx11::string::operator=
                      ((string *)&(response->cluster_info).cluster_name,(string *)local_478);
            if ((undefined1 *)local_478._0_8_ != local_478 + 0x10) {
              operator_delete((void *)local_478._0_8_,local_478._16_8_ + 1);
            }
          }
          bVar3 = Json::Value::isMember(pVVar10,"UtcStartTime");
          if (bVar3) {
            pVVar11 = Json::Value::operator[](pVVar10,"UtcStartTime");
            Json::Value::asString_abi_cxx11_((string *)local_478,pVVar11);
            std::__cxx11::string::operator=
                      ((string *)&(response->cluster_info).utc_start_time,(string *)local_478);
            if ((undefined1 *)local_478._0_8_ != local_478 + 0x10) {
              operator_delete((void *)local_478._0_8_,local_478._16_8_ + 1);
            }
          }
          bVar3 = Json::Value::isMember(pVVar10,"UtcStopTime");
          if (bVar3) {
            pVVar11 = Json::Value::operator[](pVVar10,"UtcStopTime");
            Json::Value::asString_abi_cxx11_((string *)local_478,pVVar11);
            std::__cxx11::string::operator=
                      ((string *)&(response->cluster_info).utc_stop_time,(string *)local_478);
            if ((undefined1 *)local_478._0_8_ != local_478 + 0x10) {
              operator_delete((void *)local_478._0_8_,local_478._16_8_ + 1);
            }
          }
          bVar3 = Json::Value::isMember(pVVar10,"TimeOutEnable");
          if (bVar3) {
            pVVar11 = Json::Value::operator[](pVVar10,"TimeOutEnable");
            IVar5 = Json::Value::asInt(pVVar11);
            (response->cluster_info).time_out_enable = IVar5;
          }
          bVar3 = Json::Value::isMember(pVVar10,"TimeOutTime");
          if (bVar3) {
            pVVar11 = Json::Value::operator[](pVVar10,"TimeOutTime");
            Json::Value::asString_abi_cxx11_((string *)local_478,pVVar11);
            std::__cxx11::string::operator=
                      ((string *)&(response->cluster_info).time_out_time,(string *)local_478);
            if ((undefined1 *)local_478._0_8_ != local_478 + 0x10) {
              operator_delete((void *)local_478._0_8_,local_478._16_8_ + 1);
            }
          }
          bVar3 = Json::Value::isMember(pVVar10,"TimeOutWarningWay");
          if (bVar3) {
            pVVar11 = Json::Value::operator[](pVVar10,"TimeOutWarningWay");
            IVar5 = Json::Value::asInt(pVVar11);
            (response->cluster_info).time_out_warning_way = IVar5;
          }
          bVar3 = Json::Value::isMember(pVVar10,"TimeOutOperate");
          if (bVar3) {
            pVVar11 = Json::Value::operator[](pVVar10,"TimeOutOperate");
            IVar5 = Json::Value::asInt(pVVar11);
            (response->cluster_info).time_out_operate = IVar5;
          }
          bVar3 = Json::Value::isMember(pVVar10,"ReleaseSetting");
          if (bVar3) {
            pVVar11 = Json::Value::operator[](pVVar10,"ReleaseSetting");
            IVar5 = Json::Value::asInt(pVVar11);
            (response->cluster_info).release_setting = IVar5;
          }
          bVar3 = Json::Value::isMember(pVVar10,"IsOpenOssLog");
          if (bVar3) {
            pVVar11 = Json::Value::operator[](pVVar10,"IsOpenOssLog");
            bVar3 = Json::Value::asBool(pVVar11);
            (response->cluster_info).is_open_oss_log = bVar3;
          }
          bVar3 = Json::Value::isMember(pVVar10,"Status");
          if (bVar3) {
            pVVar11 = Json::Value::operator[](pVVar10,"Status");
            IVar5 = Json::Value::asInt(pVVar11);
            (response->cluster_info).status = IVar5;
          }
          bVar3 = Json::Value::isMember(pVVar10,"LastJobStatus");
          if (bVar3) {
            pVVar11 = Json::Value::operator[](pVVar10,"LastJobStatus");
            IVar5 = Json::Value::asInt(pVVar11);
            (response->cluster_info).last_job_status = IVar5;
          }
          bVar3 = Json::Value::isMember(pVVar10,"RunningTime");
          if (bVar3) {
            pVVar11 = Json::Value::operator[](pVVar10,"RunningTime");
            IVar5 = Json::Value::asInt(pVVar11);
            (response->cluster_info).running_time = IVar5;
          }
          bVar3 = Json::Value::isMember(pVVar10,"FailReason");
          if (bVar3) {
            pVVar11 = Json::Value::operator[](pVVar10,"FailReason");
            Json::Value::asString_abi_cxx11_((string *)local_478,pVVar11);
            std::__cxx11::string::operator=
                      ((string *)&(response->cluster_info).fail_reason,(string *)local_478);
            if ((undefined1 *)local_478._0_8_ != local_478 + 0x10) {
              operator_delete((void *)local_478._0_8_,local_478._16_8_ + 1);
            }
          }
          bVar3 = Json::Value::isMember(pVVar10,"OssPath");
          if (bVar3) {
            pVVar11 = Json::Value::operator[](pVVar10,"OssPath");
            Json::Value::asString_abi_cxx11_((string *)local_478,pVVar11);
            std::__cxx11::string::operator=
                      ((string *)&(response->cluster_info).oss_path,(string *)local_478);
            if ((undefined1 *)local_478._0_8_ != local_478 + 0x10) {
              operator_delete((void *)local_478._0_8_,local_478._16_8_ + 1);
            }
          }
          bVar3 = Json::Value::isMember(pVVar10,"EmrRole4ECS");
          if (bVar3) {
            pVVar11 = Json::Value::operator[](pVVar10,"EmrRole4ECS");
            Json::Value::asString_abi_cxx11_((string *)local_478,pVVar11);
            std::__cxx11::string::operator=
                      ((string *)&(response->cluster_info).emr_role4_ec_s,(string *)local_478);
            if ((undefined1 *)local_478._0_8_ != local_478 + 0x10) {
              operator_delete((void *)local_478._0_8_,local_478._16_8_ + 1);
            }
          }
          bVar3 = Json::Value::isMember(pVVar10,"EmrRole4Oss");
          if (bVar3) {
            pVVar11 = Json::Value::operator[](pVVar10,"EmrRole4Oss");
            Json::Value::asString_abi_cxx11_((string *)local_478,pVVar11);
            std::__cxx11::string::operator=
                      ((string *)&(response->cluster_info).emr_role4_oss,(string *)local_478);
            if ((undefined1 *)local_478._0_8_ != local_478 + 0x10) {
              operator_delete((void *)local_478._0_8_,local_478._16_8_ + 1);
            }
          }
          bVar3 = Json::Value::isMember(pVVar10,"IsOpenPublicIp");
          if (bVar3) {
            pVVar10 = Json::Value::operator[](pVVar10,"IsOpenPublicIp");
            bVar3 = Json::Value::asBool(pVVar10);
            (response->cluster_info).is_open_public_ip = bVar3;
          }
        }
        bVar3 = Json::Value::isMember(&local_4b8,"SoftwareInfo");
        if (bVar3) {
          pVVar10 = Json::Value::operator[](&local_4b8,"SoftwareInfo");
          bVar3 = Json::Value::isMember(pVVar10,"EmrVer");
          if (bVar3) {
            pVVar11 = Json::Value::operator[](pVVar10,"EmrVer");
            Json::Value::asString_abi_cxx11_((string *)local_478,pVVar11);
            std::__cxx11::string::operator=((string *)&response->software_info,(string *)local_478);
            if ((undefined1 *)local_478._0_8_ != local_478 + 0x10) {
              operator_delete((void *)local_478._0_8_,local_478._16_8_ + 1);
            }
          }
          bVar3 = Json::Value::isMember(pVVar10,"ClusterType");
          if (bVar3) {
            pVVar11 = Json::Value::operator[](pVVar10,"ClusterType");
            Json::Value::asString_abi_cxx11_((string *)local_478,pVVar11);
            std::__cxx11::string::operator=
                      ((string *)&(response->software_info).cluster_type,(string *)local_478);
            if ((undefined1 *)local_478._0_8_ != local_478 + 0x10) {
              operator_delete((void *)local_478._0_8_,local_478._16_8_ + 1);
            }
          }
          bVar3 = Json::Value::isMember(pVVar10,"Softwares");
          if (bVar3) {
            pVVar10 = Json::Value::operator[](pVVar10,"Softwares");
            Json::Value::asString_abi_cxx11_((string *)local_478,pVVar10);
            std::__cxx11::string::operator=
                      ((string *)&(response->software_info).softwares,(string *)local_478);
            if ((undefined1 *)local_478._0_8_ != local_478 + 0x10) {
              operator_delete((void *)local_478._0_8_,local_478._16_8_ + 1);
            }
          }
        }
        bVar3 = Json::Value::isMember(&local_4b8,"EcsInfo");
        if (bVar3) {
          pVVar10 = Json::Value::operator[](&local_4b8,"EcsInfo");
          bVar3 = Json::Value::isMember(pVVar10,"RegionId");
          if (bVar3) {
            pVVar11 = Json::Value::operator[](pVVar10,"RegionId");
            Json::Value::asString_abi_cxx11_((string *)local_478,pVVar11);
            std::__cxx11::string::operator=
                      ((string *)&(response->ecs_info).region_id,(string *)local_478);
            if ((undefined1 *)local_478._0_8_ != local_478 + 0x10) {
              operator_delete((void *)local_478._0_8_,local_478._16_8_ + 1);
            }
          }
          bVar3 = Json::Value::isMember(pVVar10,"ZoneId");
          if (bVar3) {
            pVVar11 = Json::Value::operator[](pVVar10,"ZoneId");
            Json::Value::asString_abi_cxx11_((string *)local_478,pVVar11);
            std::__cxx11::string::operator=
                      ((string *)&(response->ecs_info).zone_id,(string *)local_478);
            if ((undefined1 *)local_478._0_8_ != local_478 + 0x10) {
              operator_delete((void *)local_478._0_8_,local_478._16_8_ + 1);
            }
          }
          bVar3 = Json::Value::isMember(pVVar10,"ImageId");
          if (bVar3) {
            pVVar11 = Json::Value::operator[](pVVar10,"ImageId");
            Json::Value::asString_abi_cxx11_((string *)local_478,pVVar11);
            std::__cxx11::string::operator=
                      ((string *)&(response->ecs_info).image_id,(string *)local_478);
            if ((undefined1 *)local_478._0_8_ != local_478 + 0x10) {
              operator_delete((void *)local_478._0_8_,local_478._16_8_ + 1);
            }
          }
          bVar3 = Json::Value::isMember(pVVar10,"ImageName");
          if (bVar3) {
            pVVar11 = Json::Value::operator[](pVVar10,"ImageName");
            Json::Value::asString_abi_cxx11_((string *)local_478,pVVar11);
            std::__cxx11::string::operator=
                      ((string *)&(response->ecs_info).image_name,(string *)local_478);
            if ((undefined1 *)local_478._0_8_ != local_478 + 0x10) {
              operator_delete((void *)local_478._0_8_,local_478._16_8_ + 1);
            }
          }
          bVar3 = Json::Value::isMember(pVVar10,"SparkVersion");
          if (bVar3) {
            pVVar11 = Json::Value::operator[](pVVar10,"SparkVersion");
            Json::Value::asString_abi_cxx11_((string *)local_478,pVVar11);
            std::__cxx11::string::operator=
                      ((string *)&(response->ecs_info).spark_version,(string *)local_478);
            if ((undefined1 *)local_478._0_8_ != local_478 + 0x10) {
              operator_delete((void *)local_478._0_8_,local_478._16_8_ + 1);
            }
          }
          bVar3 = Json::Value::isMember(pVVar10,"SecurityGroupId");
          if (bVar3) {
            pVVar11 = Json::Value::operator[](pVVar10,"SecurityGroupId");
            Json::Value::asString_abi_cxx11_((string *)local_478,pVVar11);
            std::__cxx11::string::operator=
                      ((string *)&(response->ecs_info).security_group_id,(string *)local_478);
            if ((undefined1 *)local_478._0_8_ != local_478 + 0x10) {
              operator_delete((void *)local_478._0_8_,local_478._16_8_ + 1);
            }
          }
          bVar3 = Json::Value::isMember(pVVar10,"TotalCount");
          if (bVar3) {
            pVVar11 = Json::Value::operator[](pVVar10,"TotalCount");
            IVar5 = Json::Value::asInt(pVVar11);
            (response->ecs_info).total_count = IVar5;
          }
          bVar3 = Json::Value::isMember(pVVar10,"MasterCount");
          if (bVar3) {
            pVVar11 = Json::Value::operator[](pVVar10,"MasterCount");
            IVar5 = Json::Value::asInt(pVVar11);
            (response->ecs_info).master_count = IVar5;
          }
          bVar3 = Json::Value::isMember(pVVar10,"SlaveCount");
          if (bVar3) {
            pVVar11 = Json::Value::operator[](pVVar10,"SlaveCount");
            IVar5 = Json::Value::asInt(pVVar11);
            (response->ecs_info).slave_count = IVar5;
          }
          bVar3 = Json::Value::isMember(pVVar10,"EcsRoles");
          if (bVar3) {
            pVVar11 = Json::Value::operator[](pVVar10,"EcsRoles");
            bVar3 = Json::Value::isMember(pVVar11,"EcsRole");
            if (bVar3) {
              pVVar10 = Json::Value::operator[](pVVar10,"EcsRoles");
              local_480 = Json::Value::operator[](pVVar10,"EcsRole");
              bVar3 = Json::Value::isArray(local_480);
              if ((bVar3) && (AVar6 = Json::Value::size(local_480), AVar6 != 0)) {
                pcVar2 = local_360 + 0x10;
                uVar13 = 0;
                do {
                  local_478._0_8_ = (pointer)0x0;
                  local_478._8_8_ = (pointer)0x0;
                  local_478._16_8_ = 0;
                  local_458._M_p = (pointer)&local_448;
                  local_450 = 0;
                  local_448._M_local_buf[0] = '\0';
                  local_438._M_p = (pointer)&local_428;
                  local_430 = 0;
                  local_428._M_local_buf[0] = '\0';
                  local_418._M_p = (pointer)&local_408;
                  local_410 = 0;
                  local_408._M_local_buf[0] = '\0';
                  local_3f8._M_p = (pointer)&local_3e8;
                  local_3f0 = 0;
                  local_3e8._M_local_buf[0] = '\0';
                  local_3d0._M_p = (pointer)&local_3c0;
                  local_3c8 = 0;
                  local_3c0._M_local_buf[0] = '\0';
                  local_3b0._M_p = (pointer)&local_3a0;
                  local_3a8 = 0;
                  local_3a0._M_local_buf[0] = '\0';
                  local_390._M_p = (pointer)&local_380;
                  local_388 = 0;
                  local_380._M_local_buf[0] = '\0';
                  local_364 = uVar13;
                  pVVar10 = Json::Value::operator[](local_480,uVar13);
                  bVar3 = Json::Value::isMember(pVVar10,"IsMaster");
                  if (bVar3) {
                    pVVar11 = Json::Value::operator[](pVVar10,"IsMaster");
                    local_478[0x18] = Json::Value::asBool(pVVar11);
                  }
                  bVar3 = Json::Value::isMember(pVVar10,"InstanceType");
                  if (bVar3) {
                    pVVar11 = Json::Value::operator[](pVVar10,"InstanceType");
                    Json::Value::asString_abi_cxx11_((string *)local_360,pVVar11);
                    std::__cxx11::string::operator=((string *)&local_458,(string *)local_360);
                    if ((pointer)local_360._0_8_ != pcVar2) {
                      operator_delete((void *)local_360._0_8_,
                                      CONCAT71(local_360._17_7_,local_360[0x10]) + 1);
                    }
                  }
                  bVar3 = Json::Value::isMember(pVVar10,"Payment");
                  if (bVar3) {
                    pVVar11 = Json::Value::operator[](pVVar10,"Payment");
                    Json::Value::asString_abi_cxx11_((string *)local_360,pVVar11);
                    std::__cxx11::string::operator=((string *)&local_438,(string *)local_360);
                    if ((pointer)local_360._0_8_ != pcVar2) {
                      operator_delete((void *)local_360._0_8_,
                                      CONCAT71(local_360._17_7_,local_360[0x10]) + 1);
                    }
                  }
                  bVar3 = Json::Value::isMember(pVVar10,"CpuCore");
                  if (bVar3) {
                    pVVar11 = Json::Value::operator[](pVVar10,"CpuCore");
                    Json::Value::asString_abi_cxx11_((string *)local_360,pVVar11);
                    std::__cxx11::string::operator=((string *)&local_418,(string *)local_360);
                    if ((pointer)local_360._0_8_ != pcVar2) {
                      operator_delete((void *)local_360._0_8_,
                                      CONCAT71(local_360._17_7_,local_360[0x10]) + 1);
                    }
                  }
                  bVar3 = Json::Value::isMember(pVVar10,"MemoryCapacity");
                  if (bVar3) {
                    pVVar11 = Json::Value::operator[](pVVar10,"MemoryCapacity");
                    Json::Value::asString_abi_cxx11_((string *)local_360,pVVar11);
                    std::__cxx11::string::operator=((string *)&local_3f8,(string *)local_360);
                    if ((pointer)local_360._0_8_ != pcVar2) {
                      operator_delete((void *)local_360._0_8_,
                                      CONCAT71(local_360._17_7_,local_360[0x10]) + 1);
                    }
                  }
                  bVar3 = Json::Value::isMember(pVVar10,"DiskType");
                  if (bVar3) {
                    pVVar11 = Json::Value::operator[](pVVar10,"DiskType");
                    local_3d8 = Json::Value::asInt(pVVar11);
                  }
                  bVar3 = Json::Value::isMember(pVVar10,"DiskCapacity");
                  if (bVar3) {
                    pVVar11 = Json::Value::operator[](pVVar10,"DiskCapacity");
                    local_3d4 = Json::Value::asInt(pVVar11);
                  }
                  bVar3 = Json::Value::isMember(pVVar10,"BandWidth");
                  if (bVar3) {
                    pVVar11 = Json::Value::operator[](pVVar10,"BandWidth");
                    Json::Value::asString_abi_cxx11_((string *)local_360,pVVar11);
                    std::__cxx11::string::operator=((string *)&local_3d0,(string *)local_360);
                    if ((pointer)local_360._0_8_ != pcVar2) {
                      operator_delete((void *)local_360._0_8_,
                                      CONCAT71(local_360._17_7_,local_360[0x10]) + 1);
                    }
                  }
                  bVar3 = Json::Value::isMember(pVVar10,"NetPayType");
                  if (bVar3) {
                    pVVar11 = Json::Value::operator[](pVVar10,"NetPayType");
                    Json::Value::asString_abi_cxx11_((string *)local_360,pVVar11);
                    std::__cxx11::string::operator=((string *)&local_3b0,(string *)local_360);
                    if ((pointer)local_360._0_8_ != pcVar2) {
                      operator_delete((void *)local_360._0_8_,
                                      CONCAT71(local_360._17_7_,local_360[0x10]) + 1);
                    }
                  }
                  bVar3 = Json::Value::isMember(pVVar10,"EcsPayType");
                  if (bVar3) {
                    pVVar11 = Json::Value::operator[](pVVar10,"EcsPayType");
                    Json::Value::asString_abi_cxx11_((string *)local_360,pVVar11);
                    std::__cxx11::string::operator=((string *)&local_390,(string *)local_360);
                    if ((pointer)local_360._0_8_ != pcVar2) {
                      operator_delete((void *)local_360._0_8_,
                                      CONCAT71(local_360._17_7_,local_360[0x10]) + 1);
                    }
                  }
                  bVar3 = Json::Value::isMember(pVVar10,"Nodes");
                  if (bVar3) {
                    pVVar11 = Json::Value::operator[](pVVar10,"Nodes");
                    bVar3 = Json::Value::isMember(pVVar11,"Node");
                    if (bVar3) {
                      pVVar10 = Json::Value::operator[](pVVar10,"Nodes");
                      pVVar10 = Json::Value::operator[](pVVar10,"Node");
                      bVar3 = Json::Value::isArray(pVVar10);
                      local_370 = pVVar10;
                      if ((bVar3) && (AVar6 = Json::Value::size(pVVar10), AVar6 != 0)) {
                        uVar13 = 0;
                        do {
                          local_360._8_8_ = 0;
                          local_360[0x10] = '\0';
                          local_340._M_p = (pointer)&local_330;
                          local_338 = 0;
                          local_330._M_local_buf[0] = '\0';
                          local_320._M_p = (pointer)&local_310;
                          local_318 = 0;
                          local_310._M_local_buf[0] = '\0';
                          local_300._M_p = (pointer)&local_2f0;
                          local_2f8 = 0;
                          local_2f0._M_local_buf[0] = '\0';
                          local_360._0_8_ = pcVar2;
                          pVVar10 = Json::Value::operator[](local_370,uVar13);
                          bVar3 = Json::Value::isMember(pVVar10,"InstanceId");
                          if (bVar3) {
                            pVVar11 = Json::Value::operator[](pVVar10,"InstanceId");
                            Json::Value::asString_abi_cxx11_(&local_4a0,pVVar11);
                            std::__cxx11::string::operator=
                                      ((string *)local_360,(string *)&local_4a0);
                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)local_4a0._M_dataplus._M_p != &local_4a0.field_2) {
                              operator_delete(local_4a0._M_dataplus._M_p,
                                              local_4a0.field_2._M_allocated_capacity + 1);
                            }
                          }
                          bVar3 = Json::Value::isMember(pVVar10,"PubIp");
                          if (bVar3) {
                            pVVar11 = Json::Value::operator[](pVVar10,"PubIp");
                            Json::Value::asString_abi_cxx11_(&local_4a0,pVVar11);
                            std::__cxx11::string::operator=
                                      ((string *)&local_340,(string *)&local_4a0);
                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)local_4a0._M_dataplus._M_p != &local_4a0.field_2) {
                              operator_delete(local_4a0._M_dataplus._M_p,
                                              local_4a0.field_2._M_allocated_capacity + 1);
                            }
                          }
                          bVar3 = Json::Value::isMember(pVVar10,"InnerIp");
                          if (bVar3) {
                            pVVar11 = Json::Value::operator[](pVVar10,"InnerIp");
                            Json::Value::asString_abi_cxx11_(&local_4a0,pVVar11);
                            std::__cxx11::string::operator=
                                      ((string *)&local_320,(string *)&local_4a0);
                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)local_4a0._M_dataplus._M_p != &local_4a0.field_2) {
                              operator_delete(local_4a0._M_dataplus._M_p,
                                              local_4a0.field_2._M_allocated_capacity + 1);
                            }
                          }
                          bVar3 = Json::Value::isMember(pVVar10,"DiskInfo");
                          if (bVar3) {
                            pVVar10 = Json::Value::operator[](pVVar10,"DiskInfo");
                            Json::Value::asString_abi_cxx11_(&local_4a0,pVVar10);
                            std::__cxx11::string::operator=
                                      ((string *)&local_300,(string *)&local_4a0);
                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)local_4a0._M_dataplus._M_p != &local_4a0.field_2) {
                              operator_delete(local_4a0._M_dataplus._M_p,
                                              local_4a0.field_2._M_allocated_capacity + 1);
                            }
                          }
                          std::
                          vector<aliyun::EmrDescribeExecutePlanNodeType,_std::allocator<aliyun::EmrDescribeExecutePlanNodeType>_>
                          ::push_back((vector<aliyun::EmrDescribeExecutePlanNodeType,_std::allocator<aliyun::EmrDescribeExecutePlanNodeType>_>
                                       *)local_478,(value_type *)local_360);
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_300._M_p != &local_2f0) {
                            operator_delete(local_300._M_p,
                                            CONCAT71(local_2f0._M_allocated_capacity._1_7_,
                                                     local_2f0._M_local_buf[0]) + 1);
                          }
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_320._M_p != &local_310) {
                            operator_delete(local_320._M_p,
                                            CONCAT71(local_310._M_allocated_capacity._1_7_,
                                                     local_310._M_local_buf[0]) + 1);
                          }
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_340._M_p != &local_330) {
                            operator_delete(local_340._M_p,
                                            CONCAT71(local_330._M_allocated_capacity._1_7_,
                                                     local_330._M_local_buf[0]) + 1);
                          }
                          if ((pointer)local_360._0_8_ != pcVar2) {
                            operator_delete((void *)local_360._0_8_,
                                            CONCAT71(local_360._17_7_,local_360[0x10]) + 1);
                          }
                          AVar6 = Json::Value::size(local_370);
                          uVar13 = uVar13 + 1;
                        } while (uVar13 < AVar6);
                      }
                    }
                  }
                  std::
                  vector<aliyun::EmrDescribeExecutePlanEcsRoleType,_std::allocator<aliyun::EmrDescribeExecutePlanEcsRoleType>_>
                  ::push_back(&(response->ecs_info).ecs_roles,(value_type *)local_478);
                  EmrDescribeExecutePlanEcsRoleType::~EmrDescribeExecutePlanEcsRoleType
                            ((EmrDescribeExecutePlanEcsRoleType *)local_478);
                  AVar6 = Json::Value::size(local_480);
                  uVar13 = local_364 + 1;
                } while (uVar13 < AVar6);
              }
            }
          }
        }
      }
      goto LAB_001361ff;
    }
    if (error_info == (EmrErrorInfo *)0x0) goto LAB_001361fa;
    pcVar7 = "parse response failed";
  }
  else {
    if (error_info == (EmrErrorInfo *)0x0) {
LAB_001361fa:
      iVar4 = -1;
      goto LAB_001361ff;
    }
    pcVar7 = "connect to host failed";
  }
  iVar4 = -1;
  std::__cxx11::string::_M_replace
            ((ulong)&error_info->code,0,(char *)(error_info->code)._M_string_length,(ulong)pcVar7);
LAB_001361ff:
  AliRpcRequest::~AliRpcRequest(this_00);
  operator_delete(this_00,0x2c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140.commentsBefore_._M_dataplus._M_p != &local_140.commentsBefore_.field_2) {
    operator_delete(local_140.commentsBefore_._M_dataplus._M_p,
                    local_140.commentsBefore_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140.document_._M_dataplus._M_p != &local_140.document_.field_2) {
    operator_delete(local_140.document_._M_dataplus._M_p,
                    local_140.document_.field_2._M_allocated_capacity + 1);
  }
  std::deque<Json::Reader::ErrorInfo,_std::allocator<Json::Reader::ErrorInfo>_>::~deque
            (&local_140.errors_);
  std::_Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>::~_Deque_base
            ((_Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_> *)&local_140);
  Json::Value::~Value(&local_4b8);
  if (local_2e0 != local_2d0) {
    operator_delete(local_2e0,local_2d0[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
    operator_delete(local_2c0._M_dataplus._M_p,
                    CONCAT71(local_2c0.field_2._M_allocated_capacity._1_7_,
                             local_2c0.field_2._M_local_buf[0]) + 1);
  }
  return iVar4;
}

Assistant:

int Emr::DescribeExecutePlan(const EmrDescribeExecutePlanRequestType& req,
                      EmrDescribeExecutePlanResponseType* response,
                       EmrErrorInfo* error_info) {
  std::string str_response;
  int status_code;
  int ret = 0;
  bool parse_success = false;
  std::string secheme = this->use_tls_ ? "https" : "http";
  AliRpcRequest* req_rpc = new AliRpcRequest(version_,
                         appid_,
                         secret_,
                         secheme + "://" + host_);
  if((!this->use_tls_) && this->proxy_host_ && this->proxy_host_[0]) {
    req_rpc->SetHttpProxy( this->proxy_host_);
  }
  Json::Value val;
  Json::Reader reader;
  req_rpc->AddRequestQuery("Action","DescribeExecutePlan");
  if(!req.id.empty()) {
    req_rpc->AddRequestQuery("Id", req.id);
  }
  if(this->region_id_ && this->region_id_[0]) {
    req_rpc->AddRequestQuery("RegionId", this->region_id_);
  }
  if(req_rpc->CommitRequest() != 0) {
     if(error_info) {
       error_info->code = "connect to host failed";
     }
     ret = -1;
     goto out;
  }
  status_code = req_rpc->WaitResponseHeaderComplete();
  req_rpc->ReadResponseBody(str_response);
  if(status_code > 0 && !str_response.empty()){
    parse_success = reader.parse(str_response, val);
  }
  if(!parse_success) {
    if(error_info) {
      error_info->code = "parse response failed";
    }
    ret = -1;
    goto out;
  }
  if(status_code!= 200 && error_info && parse_success) {
    error_info->request_id = val.isMember("RequestId") ? val["RequestId"].asString(): "";
    error_info->code = val.isMember("Code") ? val["Code"].asString(): "";
    error_info->host_id = val.isMember("HostId") ? val["HostId"].asString(): "";
    error_info->message = val.isMember("Message") ? val["Message"].asString(): "";
  }
  if(status_code== 200 && response) {
    Json2Type(val, response);
  }
  ret = status_code;
out:
  delete req_rpc;
  return ret;
}